

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

boolean validate_object(obj *obj,char *lets,char *word)

{
  obj_use_status oVar1;
  char *pcVar2;
  
  if (((lets == (char *)0x0) || (pcVar2 = strchr(lets,0x14), pcVar2 != (char *)0x0)) ||
     (pcVar2 = strchr(lets,(int)obj->oclass), pcVar2 != (char *)0x0)) {
    oVar1 = object_selection_checks(obj,word);
    if (oVar1 == OBJECT_USABLE) {
      return '\x01';
    }
    if (oVar1 == ARMOR_TAKEOFF_BLOCKED) {
      pline("The rest of your armor is in the way.");
      return '\0';
    }
    if (oVar1 == CURRENTLY_NOT_USABLE) {
      return '\x01';
    }
  }
  silly_thing(word,obj);
  return '\0';
}

Assistant:

boolean validate_object(struct obj *obj, const char *lets, const char *word)
{
	boolean allowall = !lets || !!strchr(lets, ALL_CLASSES);
	if (!allowall && lets && !strchr(lets, obj->oclass)) {
	    silly_thing(word, obj);
	    return FALSE;
	}

	switch (object_selection_checks(obj, word)) {
	    default:
	    case ALREADY_IN_USE:
	    case UNSUITABLE_USE:
		silly_thing(word, obj);
		return FALSE;

	    case ARMOR_TAKEOFF_BLOCKED:
		pline("The rest of your armor is in the way.");
		return FALSE;

	    case OBJECT_USABLE:
	    case CURRENTLY_NOT_USABLE:
		return TRUE;
	}
}